

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::GeneratorContext::GetCompilerVersion
          (GeneratorContext *this,Version *version)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  version->major_ = 3;
  version->minor_ = 0x13;
  version->patch_ = 0;
  *(byte *)(version->_has_bits_).has_bits_ = (byte)(version->_has_bits_).has_bits_[0] | 0xf;
  uVar1 = (version->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&version->suffix_,"",puVar2);
  return;
}

Assistant:

void GeneratorContext::GetCompilerVersion(Version* version) const {
  version->set_major(GOOGLE_PROTOBUF_VERSION / 1000000);
  version->set_minor(GOOGLE_PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(GOOGLE_PROTOBUF_VERSION % 1000);
  version->set_suffix(GOOGLE_PROTOBUF_VERSION_SUFFIX);
}